

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plg.cpp
# Opt level: O0

bool __thiscall rw::PluginList::streamRead(PluginList *this,Stream *stream,void *object)

{
  Plugin *pPVar1;
  bool bVar2;
  Plugin *pPVar3;
  Plugin *p_1;
  LLLink *lnk_1;
  LLLink *_next_1;
  Plugin *p;
  LLLink *lnk;
  LLLink *_next;
  uint local_38;
  ChunkHeaderInfo header;
  int32 length;
  void *object_local;
  Stream *stream_local;
  PluginList *this_local;
  
  unique0x10000206 = object;
  bVar2 = findChunk(stream,3,&header.version,(uint32 *)0x0);
  if (bVar2) {
    for (; 0 < (int)header.version; header.version = header.version - local_38) {
      bVar2 = readChunkHeaderInfo(stream,(ChunkHeaderInfo *)((long)&_next + 4));
      if (!bVar2) {
        return false;
      }
      header.version = header.version - 0xc;
      pPVar1 = (Plugin *)(this->plugins).link.next;
      do {
        p = pPVar1;
        pPVar1 = *(Plugin **)p;
        pPVar3 = (Plugin *)LinkList::end(&this->plugins);
        if (p == pPVar3) {
          (*stream->_vptr_Stream[5])(stream,(ulong)local_38,1);
          goto LAB_00113be7;
        }
      } while ((*(int *)&p[-1].read != _next._4_4_) || (p[-1].alwaysCallback == (AlwaysCallback)0x0)
              );
      (*p[-1].alwaysCallback)(stream,local_38,(int32)stack0xffffffffffffffd8);
LAB_00113be7:
    }
    pPVar1 = (Plugin *)(this->plugins).link.next;
    while( true ) {
      p_1 = pPVar1;
      pPVar1 = *(Plugin **)p_1;
      pPVar3 = (Plugin *)LinkList::end(&this->plugins);
      if (p_1 == pPVar3) break;
      if (p_1[-1].inGlobalList.next != (LLLink *)0x0) {
        (*(code *)p_1[-1].inGlobalList.next)
                  (stack0xffffffffffffffd8,*(undefined4 *)&p_1[-1].copy,
                   *(undefined4 *)((long)&p_1[-1].copy + 4));
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
PluginList::streamRead(Stream *stream, void *object)
{
	int32 length;
	ChunkHeaderInfo header;
	if(!findChunk(stream, ID_EXTENSION, (uint32*)&length, nil))
		return false;
	while(length > 0){
		if(!readChunkHeaderInfo(stream, &header))
			return false;
		length -= 12;
		FORLIST(lnk, this->plugins){
			Plugin *p = PLG(lnk);
			if(p->id == header.type && p->read){
				p->read(stream, header.length,
				        object, p->offset, p->size);
				goto cont;
			}
		}
		stream->seek(header.length);
cont:
		length -= header.length;
	}

	// now the always callbacks
	FORLIST(lnk, this->plugins){
		Plugin *p = PLG(lnk);
		if(p->alwaysCallback)
			p->alwaysCallback(object, p->offset, p->size);
	}
	return true;
}